

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_common_content_access<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::pair<unsigned_int,unsigned_int>>
               (Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                *col,set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *setcont,vector<unsigned_int,_std::allocator<unsigned_int>_> *veccont)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  pointer ppEVar4;
  Field_operators *pFVar5;
  pointer puVar6;
  iterator iVar7;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *pEVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  pointer puVar12;
  Entry *pEVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  pointer ppEVar20;
  ulong uVar21;
  ID_index IVar22;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  undefined **local_1b0;
  ulong local_1a8;
  shared_count sStack_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined8 local_180;
  undefined1 local_178 [16];
  _Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_int>_> local_168;
  size_t local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x11d);
  get_column_content_via_iterators<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
            ((column_content<Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Column_types)2,_false,_false,_false>_>_>_>
              *)&local_180,col);
  if (local_158 == (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    bVar9 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>,std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>>
                      (local_168,(_Base_ptr)local_178,
                       (setcont->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar9 = false;
  }
  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar9);
  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198 = (undefined1 *)&local_190;
  local_190 = "get_column_content_via_iterators(col) == setcont";
  local_188 = "";
  local_1a8 = local_1a8 & 0xffffffffffffff00;
  local_1b0 = &PTR__lazy_ostream_001b87f0;
  sStack_1a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_1c8 + 0x10));
  std::
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&local_180);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x11e);
  uVar17 = (uint)((ulong)((long)(veccont->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(veccont->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  uVar18 = uVar17;
  if ((int)uVar17 < 0) {
    ppEVar20 = (col->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((col->column_).
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish == ppEVar20) {
      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar9 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish ==
              (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
      goto LAB_0013ccae;
    }
    uVar18 = (*ppEVar20)->rowIndex_ + 1;
  }
  local_180 = (undefined **)((ulong)local_180._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1c8,(long)(int)uVar18,(value_type_conflict *)&local_180,
             (allocator_type *)&local_190);
  ppEVar20 = (col->column_).
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppEVar4 = (col->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar20 != ppEVar4) {
    pFVar5 = col->operators_;
    do {
      uVar2 = (*ppEVar20)->rowIndex_;
      if (uVar2 < uVar18) {
        uVar16 = ((*ppEVar20)->super_Entry_field_element_option).element_;
        uVar15 = local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar2];
        uVar3 = pFVar5->characteristic_;
        if (uVar3 <= uVar15) {
          uVar15 = uVar15 % uVar3;
        }
        if (uVar3 <= uVar16) {
          uVar16 = uVar16 % uVar3;
        }
        uVar10 = uVar3;
        if (uVar15 + uVar16 < uVar3) {
          uVar10 = 0;
        }
        if (CARRY4(uVar15,uVar16)) {
          uVar10 = uVar3;
        }
        local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] = (uVar15 + uVar16) - uVar10;
      }
      ppEVar20 = ppEVar20 + 1;
    } while (ppEVar20 != ppEVar4);
  }
  puVar12 = local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar6 = local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((int)uVar17 < 0) {
    do {
      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar6;
      puVar12 = local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      puVar12 = local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      puVar6 = local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
    } while (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish[-1] == 0);
  }
  puVar6 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)puVar12 -
      (long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)(veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar6) {
    if (puVar12 ==
        local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar9 = true;
    }
    else {
      iVar11 = bcmp(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,puVar6,
                    (long)puVar12 -
                    (long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
      bVar9 = iVar11 == 0;
    }
  }
  else {
    bVar9 = false;
  }
LAB_0013ccae:
  local_168._M_node = (_Base_ptr)&local_190;
  local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,bVar9);
  local_1a8 = 0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  local_190 = "col.get_content(veccont.size()) == veccont";
  local_188 = "";
  local_178[0] = 0;
  local_180 = &PTR__lazy_ostream_001b87f0;
  local_178._8_8_ = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_98 = "";
    local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x124);
    pEVar13 = Gudhi::persistence_matrix::
              Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
              ::_pop_pivot(col);
    if (pEVar13 != (Entry *)0x0) {
      iVar7._M_current =
           (col->column_).
           super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (col->column_).
          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_180 = (undefined **)pEVar13;
        std::
        vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
        ::
        _M_realloc_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*const&>
                  ((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
                    *)&col->column_,iVar7,
                   (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                    **)&local_180);
        ppEVar20 = (col->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *iVar7._M_current = pEVar13;
        ppEVar20 = (col->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
        (col->column_).
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppEVar20;
      }
      ppEVar4 = (col->column_).
                super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar8 = ppEVar20[-1];
      lVar19 = (long)ppEVar20 - (long)ppEVar4 >> 3;
      uVar14 = lVar19 - 1;
      if (1 < lVar19) {
        uVar18 = pEVar8->rowIndex_;
        do {
          uVar1 = uVar14 - 1;
          uVar21 = uVar1 >> 1;
          if (uVar18 <= ppEVar4[uVar21]->rowIndex_) goto LAB_0013cf66;
          ppEVar4[uVar14] = ppEVar4[uVar21];
          uVar14 = uVar21;
        } while (1 < uVar1);
        uVar14 = 0;
      }
LAB_0013cf66:
      ppEVar4[uVar14] = pEVar8;
    }
    local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,pEVar13 == (Entry *)0x0);
    local_1a8 = 0;
    sStack_1a0.pi_ = (sp_counted_base *)0x0;
    local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x196e27;
    local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x196e35;
    local_178[0] = 0;
    local_180 = &PTR__lazy_ostream_001b87f0;
    local_178._8_8_ = &boost::unit_test::lazy_ostream::inst;
    local_168._M_node = (_Base_ptr)&local_1c8;
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_b8 = "";
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x126);
    pEVar13 = Gudhi::persistence_matrix::
              Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
              ::_pop_pivot(col);
    if (pEVar13 != (Entry *)0x0) {
      iVar7._M_current =
           (col->column_).
           super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (col->column_).
          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_180 = (undefined **)pEVar13;
        std::
        vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
        ::
        _M_realloc_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*const&>
                  ((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
                    *)&col->column_,iVar7,
                   (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                    **)&local_180);
        ppEVar20 = (col->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *iVar7._M_current = pEVar13;
        ppEVar20 = (col->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
        (col->column_).
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppEVar20;
      }
      ppEVar4 = (col->column_).
                super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar8 = ppEVar20[-1];
      lVar19 = (long)ppEVar20 - (long)ppEVar4 >> 3;
      uVar14 = lVar19 - 1;
      if (1 < lVar19) {
        uVar18 = pEVar8->rowIndex_;
        do {
          uVar1 = uVar14 - 1;
          uVar21 = uVar1 >> 1;
          if (uVar18 <= ppEVar4[uVar21]->rowIndex_) goto LAB_0013ce78;
          ppEVar4[uVar14] = ppEVar4[uVar21];
          uVar14 = uVar21;
        } while (1 < uVar1);
        uVar14 = 0;
      }
LAB_0013ce78:
      ppEVar4[uVar14] = pEVar8;
    }
    local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,pEVar13 != (Entry *)0x0);
    local_1a8 = 0;
    sStack_1a0.pi_ = (sp_counted_base *)0x0;
    local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x196e26;
    local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x196e35;
    local_178[0] = 0;
    local_180 = &PTR__lazy_ostream_001b87f0;
    local_178._8_8_ = &boost::unit_test::lazy_ostream::inst;
    local_168._M_node = (_Base_ptr)&local_1c8;
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_e8 = "";
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  puVar12 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar12) {
    uVar14 = 0;
    do {
      IVar22 = (ID_index)uVar14;
      if (puVar12[uVar14] == 0) {
        local_100 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_f8 = "";
        local_110 = &boost::unit_test::basic_cstring<char_const>::null;
        local_108 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x12a);
        ppEVar20 = (col->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar4 = (col->column_).
                  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppEVar20 == ppEVar4) {
          bVar9 = true;
        }
        else {
          uVar18 = 0;
          do {
            if ((*ppEVar20)->rowIndex_ == IVar22) {
              uVar17 = ((*ppEVar20)->super_Entry_field_element_option).element_;
              uVar2 = col->operators_->characteristic_;
              if (uVar2 <= uVar18) {
                uVar18 = uVar18 % uVar2;
              }
              if (uVar2 <= uVar17) {
                uVar17 = uVar17 % uVar2;
              }
              uVar16 = uVar2;
              if (uVar18 + uVar17 < uVar2) {
                uVar16 = 0;
              }
              if (CARRY4(uVar18,uVar17)) {
                uVar16 = uVar2;
              }
              uVar18 = (uVar18 + uVar17) - uVar16;
            }
            ppEVar20 = ppEVar20 + 1;
          } while (ppEVar20 != ppEVar4);
          bVar9 = uVar18 == 0;
        }
        local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,bVar9);
        local_1a8 = 0;
        sStack_1a0.pi_ = (sp_counted_base *)0x0;
        local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x196e36;
        local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x196e49;
        local_178[0] = 0;
        local_180 = &PTR__lazy_ostream_001b87f0;
        local_178._8_8_ = &boost::unit_test::lazy_ostream::inst;
        local_168._M_node = (_Base_ptr)&local_1c8;
        local_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_118 = "";
        boost::test_tools::tt_detail::report_assertion(&local_1b0,&local_180,&local_120,0x12a,1,0,0)
        ;
      }
      else {
        local_130 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_128 = "";
        local_140 = &boost::unit_test::basic_cstring<char_const>::null;
        local_138 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,300);
        ppEVar20 = (col->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar4 = (col->column_).
                  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar14 = 0;
        if (ppEVar20 != ppEVar4) {
          do {
            uVar18 = (uint)uVar14;
            if ((*ppEVar20)->rowIndex_ == IVar22) {
              uVar17 = ((*ppEVar20)->super_Entry_field_element_option).element_;
              uVar2 = col->operators_->characteristic_;
              if (uVar2 <= uVar18) {
                uVar18 = (uint)(uVar14 % (ulong)uVar2);
              }
              if (uVar2 <= uVar17) {
                uVar17 = uVar17 % uVar2;
              }
              uVar16 = uVar2;
              if (uVar18 + uVar17 < uVar2) {
                uVar16 = 0;
              }
              if (CARRY4(uVar18,uVar17)) {
                uVar16 = uVar2;
              }
              uVar14 = (ulong)((uVar18 + uVar17) - uVar16);
            }
            ppEVar20 = ppEVar20 + 1;
          } while (ppEVar20 != ppEVar4);
          uVar14 = (ulong)((int)uVar14 != 0);
        }
        local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,(char)uVar14);
        local_1a8 = 0;
        sStack_1a0.pi_ = (sp_counted_base *)0x0;
        local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x196e37;
        local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x196e49;
        local_178[0] = 0;
        local_180 = &PTR__lazy_ostream_001b87f0;
        local_178._8_8_ = &boost::unit_test::lazy_ostream::inst;
        local_168._M_node = (_Base_ptr)&local_1c8;
        local_150 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_148 = "";
        boost::test_tools::tt_detail::report_assertion(&local_1b0,&local_180,&local_150,300,1,0,0);
      }
      boost::detail::shared_count::~shared_count(&sStack_1a0);
      uVar14 = (ulong)(IVar22 + 1);
      puVar12 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(veccont->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 2)
            );
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}